

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_4_arm(TCGContext_conflict *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
                       uint32_t cofs,uint32_t oprsz,uint32_t maxsz,GVecGen4_conflict *g)

{
  byte bVar1;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGv_i64_conflict *p_Var2;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict *p_Var3;
  TCGType_conflict TVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  TCGTemp *pTVar8;
  uint uVar9;
  uintptr_t o;
  uint32_t uVar10;
  uintptr_t o_4;
  _Bool _Var11;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_TCGv_vec_conflict *fni;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_TCGv_vec_conflict *)0x0)
  {
switchD_005d0753_caseD_0:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var2 = g->fni8,
       p_Var2 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGv_i64_conflict *)0x0)) {
      _Var11 = g->write_aofs;
      uVar9 = 0;
      pTVar5 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
      pTVar6 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
      pTVar7 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
      pTVar8 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
      do {
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar6,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar9));
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar7,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(bofs + uVar9));
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar8,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(cofs + uVar9));
        (*p_Var2)(tcg_ctx,(TCGv_i64)((long)pTVar5 - (long)tcg_ctx),
                  (TCGv_i64)((long)pTVar6 - (long)tcg_ctx),(TCGv_i64)((long)pTVar7 - (long)tcg_ctx),
                  (TCGv_i64)((long)pTVar8 - (long)tcg_ctx));
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar5,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar9));
        if (_Var11 != false) {
          tcg_gen_op3_arm(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar6,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar9));
        }
        uVar9 = uVar9 + 8;
      } while (uVar9 < oprsz);
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar8 - (long)tcg_ctx) + (long)tcg_ctx));
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar7 - (long)tcg_ctx) + (long)tcg_ctx));
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar6 - (long)tcg_ctx) + (long)tcg_ctx));
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar5 - (long)tcg_ctx) + (long)tcg_ctx));
    }
    else {
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var3 = g->fni4,
         p_Var3 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict *)0x0)) {
        if (g->fno != (undefined1 *)0x0) {
          tcg_gen_gvec_4_ool_arm(tcg_ctx,dofs,aofs,bofs,cofs,oprsz,maxsz,g->data,g->fno);
          return;
        }
        __assert_fail("g->fno != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                      ,0x58b,
                      "void tcg_gen_gvec_4_arm(TCGContext *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, const GVecGen4 *)"
                     );
      }
      _Var11 = g->write_aofs;
      uVar9 = 0;
      pTVar5 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I32,false);
      pTVar6 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I32,false);
      pTVar7 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I32,false);
      pTVar8 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I32,false);
      do {
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar6,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar9));
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar7,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(bofs + uVar9));
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar8,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(cofs + uVar9));
        (*p_Var3)(tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),
                  (TCGv_i32)((long)pTVar6 - (long)tcg_ctx),(TCGv_i32)((long)pTVar7 - (long)tcg_ctx),
                  (TCGv_i32)((long)pTVar8 - (long)tcg_ctx));
        tcg_gen_op3_arm(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar5,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar9));
        if (_Var11 != false) {
          tcg_gen_op3_arm(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar6,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar9));
        }
        uVar9 = uVar9 + 4;
      } while (uVar9 < oprsz);
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)pTVar8 - (long)tcg_ctx) + (long)tcg_ctx));
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)pTVar7 - (long)tcg_ctx) + (long)tcg_ctx));
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)pTVar6 - (long)tcg_ctx) + (long)tcg_ctx));
      tcg_temp_free_internal_arm
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)pTVar5 - (long)tcg_ctx) + (long)tcg_ctx));
    }
    goto LAB_005d0bc9;
  }
  TVar4 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
  switch(TVar4) {
  case TCG_TYPE_I32:
    goto switchD_005d0753_caseD_0;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,0x593,(char *)0x0);
  case TCG_TYPE_V64:
    bVar1 = g->vece;
    _Var11 = g->write_aofs;
    fni = g->fniv;
    TVar4 = TCG_TYPE_V64;
    uVar10 = 8;
    goto LAB_005d0bbf;
  case TCG_TYPE_V128:
    break;
  case TCG_TYPE_V256:
    uVar9 = oprsz & 0xffffffe0;
    expand_4_vec(tcg_ctx,(uint)g->vece,dofs,aofs,bofs,cofs,uVar9,0x20,TCG_TYPE_V256,g->write_aofs,
                 g->fniv);
    if (uVar9 == oprsz) goto LAB_005d0bc9;
    dofs = dofs + uVar9;
    aofs = aofs + uVar9;
    bofs = bofs + uVar9;
    cofs = cofs + uVar9;
    oprsz = oprsz & 0x1f;
    maxsz = maxsz - uVar9;
  }
  bVar1 = g->vece;
  _Var11 = g->write_aofs;
  fni = g->fniv;
  TVar4 = TCG_TYPE_V128;
  uVar10 = 0x10;
LAB_005d0bbf:
  expand_4_vec(tcg_ctx,(uint)bVar1,dofs,aofs,bofs,cofs,oprsz,uVar10,TVar4,_Var11,fni);
LAB_005d0bc9:
  uVar10 = maxsz - oprsz;
  if (oprsz <= maxsz && uVar10 != 0) {
    do_dup(tcg_ctx,0,dofs + oprsz,uVar10,uVar10,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
  }
  return;
}

Assistant:

void tcg_gen_gvec_4(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs, uint32_t cofs,
                    uint32_t oprsz, uint32_t maxsz, const GVecGen4 *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs | bofs | cofs);
    check_overlap_4(dofs, aofs, bofs, cofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_4_vec(tcg_ctx, g->vece, dofs, aofs, bofs, cofs, some,
                     32, TCG_TYPE_V256, g->write_aofs, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        bofs += some;
        cofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_4_vec(tcg_ctx, g->vece, dofs, aofs, bofs, cofs, oprsz,
                     16, TCG_TYPE_V128, g->write_aofs, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_4_vec(tcg_ctx, g->vece, dofs, aofs, bofs, cofs, oprsz,
                     8, TCG_TYPE_V64, g->write_aofs, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_4_i64(tcg_ctx, dofs, aofs, bofs, cofs, oprsz,
                         g->write_aofs, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_4_i32(tcg_ctx, dofs, aofs, bofs, cofs, oprsz,
                         g->write_aofs, g->fni4);
        } else {
            assert(g->fno != NULL);
            tcg_gen_gvec_4_ool(tcg_ctx, dofs, aofs, bofs, cofs,
                               oprsz, maxsz, g->data, g->fno);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}